

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::OpenRulesFileStream(cmGlobalNinjaGenerator *this)

{
  Encoding encoding;
  cmake *this_00;
  char *pcVar1;
  cmGeneratedFileStream *this_01;
  ostream *poVar2;
  allocator local_31;
  string local_30 [8];
  string rulesFilePath;
  cmGlobalNinjaGenerator *this_local;
  
  rulesFilePath.field_2._8_8_ = this;
  this_00 = cmGlobalGenerator::GetCMakeInstance((cmGlobalGenerator *)this);
  pcVar1 = cmake::GetHomeOutputDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::operator+=(local_30,"/");
  std::__cxx11::string::operator+=(local_30,NINJA_RULES_FILE);
  if (this->RulesFileStream == (cmGeneratedFileStream *)0x0) {
    this_01 = (cmGeneratedFileStream *)operator_new(0x248);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    encoding = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                 _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(this_01,pcVar1,false,encoding);
    this->RulesFileStream = this_01;
    if (this->RulesFileStream == (cmGeneratedFileStream *)0x0) goto LAB_0073af41;
  }
  WriteDisclaimer(this,(ostream *)this->RulesFileStream);
  poVar2 = std::operator<<((ostream *)this->RulesFileStream,
                           "# This file contains all the rules used to get the outputs files\n");
  poVar2 = std::operator<<(poVar2,"# built from the input files.\n");
  poVar2 = std::operator<<(poVar2,"# It is included in the main \'");
  poVar2 = std::operator<<(poVar2,NINJA_BUILD_FILE);
  std::operator<<(poVar2,"\'.\n\n");
LAB_0073af41:
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::OpenRulesFileStream()
{
  // Compute Ninja's build file path.
  std::string rulesFilePath =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  rulesFilePath += "/";
  rulesFilePath += cmGlobalNinjaGenerator::NINJA_RULES_FILE;

  // Get a stream where to generate things.
  if (!this->RulesFileStream) {
    this->RulesFileStream = new cmGeneratedFileStream(
      rulesFilePath.c_str(), false, this->GetMakefileEncoding());
    if (!this->RulesFileStream) {
      // An error message is generated by the constructor if it cannot
      // open the file.
      return;
    }
  }

  // Write the do not edit header.
  this->WriteDisclaimer(*this->RulesFileStream);

  // Write comment about this file.
  /* clang-format off */
  *this->RulesFileStream
    << "# This file contains all the rules used to get the outputs files\n"
    << "# built from the input files.\n"
    << "# It is included in the main '" << NINJA_BUILD_FILE << "'.\n\n"
    ;
  /* clang-format on */
}